

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint64_t helper_bfextu_mem_m68k(CPUM68KState_conflict *env,uint32_t addr,int32_t ofs,uint32_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  bf_data bVar3;
  uintptr_t unaff_retaddr;
  
  bVar3 = bf_prep(addr,ofs,len);
  uVar1 = bf_load(env,bVar3.addr,bVar3.blen,unaff_retaddr);
  uVar2 = (uVar1 << ((byte)bVar3.bofs & 0x3f)) >> (-(char)bVar3.len & 0x3fU);
  return uVar2 | uVar2 << (-(char)bVar3.len & 0x3fU);
}

Assistant:

uint64_t HELPER(bfextu_mem)(CPUM68KState *env, uint32_t addr,
                            int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);

    /*
     * Put CC_N at the top of the high word; put the zero-extended value
     * at the bottom of the low word.
     */
    data <<= d.bofs;
    data >>= 64 - d.len;
    data |= data << (64 - d.len);

    return data;
}